

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.h
# Opt level: O0

cmExternalMakefileProjectGenerator * __thiscall
cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraCodeBlocksGenerator>::
CreateExternalMakefileProjectGenerator
          (cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraCodeBlocksGenerator> *this)

{
  cmExternalMakefileProjectGenerator *this_00;
  string local_48;
  cmExternalMakefileProjectGenerator *local_18;
  cmExtraCodeBlocksGenerator *p;
  cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraCodeBlocksGenerator> *this_local;
  
  p = (cmExtraCodeBlocksGenerator *)this;
  this_00 = (cmExternalMakefileProjectGenerator *)operator_new(0x48);
  cmExtraCodeBlocksGenerator::cmExtraCodeBlocksGenerator((cmExtraCodeBlocksGenerator *)this_00);
  local_18 = this_00;
  cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_
            (&local_48,&this->super_cmExternalMakefileProjectGeneratorFactory);
  cmExternalMakefileProjectGenerator::SetName(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return local_18;
}

Assistant:

cmExternalMakefileProjectGenerator* CreateExternalMakefileProjectGenerator()
    const override
  {
    T* p = new T;
    p->SetName(GetName());
    return p;
  }